

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::should_force_emit_builtin_block(CompilerGLSL *this,StorageClass storage)

{
  size_t sVar1;
  Variant *pVVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  StorageClass SVar6;
  uint32_t uVar7;
  SPIRVariable *var;
  SPIRType *pSVar8;
  bool bVar9;
  uint32_t index;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *pTVar10;
  LoopLock local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  if (storage == StorageClassOutput) {
    ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
    sVar1 = (this->super_Compiler).ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar1 == 0) {
      bVar9 = false;
    }
    else {
      pTVar10 = (this->super_Compiler).ir.ids_for_type[2].
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      local_38 = pTVar10 + sVar1;
      bVar9 = false;
      do {
        pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if ((pVVar2[pTVar10->id].type == TypeVariable) &&
           (var = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + pTVar10->id), !bVar9)) {
          pSVar8 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + *(uint *)&(var->super_IVariant).field_0xc);
          bVar3 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(pSVar8->super_IVariant).self.id,
                             DecorationBlock);
          SVar6 = var->storage;
          if (bVar3 && SVar6 == StorageClassOutput) {
            bVar4 = Compiler::is_builtin_variable(&this->super_Compiler,var);
            if (bVar4) {
              uVar7 = (uint32_t)
                      (pSVar8->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              if (uVar7 != 0) {
                index = 0;
                do {
                  bVar3 = Compiler::has_member_decoration
                                    (&this->super_Compiler,(TypeID)(pSVar8->super_IVariant).self.id,
                                     index,DecorationBuiltIn);
                  if ((((bVar3) &&
                       (uVar5 = Compiler::get_member_decoration
                                          (&this->super_Compiler,
                                           (TypeID)(pSVar8->super_IVariant).self.id,index,
                                           DecorationBuiltIn), uVar5 < 5)) && (uVar5 != 2)) &&
                     (bVar3 = Compiler::has_member_decoration
                                        (&this->super_Compiler,
                                         (TypeID)(pSVar8->super_IVariant).self.id,index,
                                         DecorationOffset), bVar3)) {
                    bVar9 = true;
                  }
                  index = index + 1;
                } while (uVar7 != index);
              }
              goto LAB_001bbe01;
            }
            SVar6 = var->storage;
          }
          if (((!bVar3 && SVar6 == StorageClassOutput) &&
              (bVar3 = Compiler::is_builtin_variable(&this->super_Compiler,var), bVar3)) &&
             ((uVar7 = Compiler::get_decoration
                                 (&this->super_Compiler,(ID)(pSVar8->super_IVariant).self.id,
                                  DecorationBuiltIn), uVar7 < 5 &&
              ((uVar7 != 2 &&
               (bVar3 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                   DecorationOffset), bVar3)))))) {
            bVar9 = true;
          }
        }
LAB_001bbe01:
        pTVar10 = pTVar10 + 1;
      } while (pTVar10 != local_38);
    }
    ParsedIR::LoopLock::~LoopLock(&local_40);
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool CompilerGLSL::should_force_emit_builtin_block(StorageClass storage)
{
	// If the builtin block uses XFB, we need to force explicit redeclaration of the builtin block.

	if (storage != StorageClassOutput)
		return false;
	bool should_force = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (should_force)
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (has_member_decoration(type.self, i, DecorationBuiltIn) &&
				    is_block_builtin(BuiltIn(get_member_decoration(type.self, i, DecorationBuiltIn))) &&
				    has_member_decoration(type.self, i, DecorationOffset))
				{
					should_force = true;
				}
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			if (is_block_builtin(BuiltIn(get_decoration(type.self, DecorationBuiltIn))) &&
			    has_decoration(var.self, DecorationOffset))
			{
				should_force = true;
			}
		}
	});

	return should_force;
}